

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.cpp
# Opt level: O1

char * xmrig::Json::getString(Value *obj,char *key,char *defaultValue)

{
  Number in_RAX;
  undefined8 local_28;
  
  local_28 = in_RAX;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&stack0xffffffffffffffd8,(Ch *)obj);
  if ((local_28 !=
       (ulong)(obj->data_).s.length * 0x20 + ((ulong)(obj->data_).s.str & 0xffffffffffff)) &&
     ((*(ushort *)(local_28 + 0x1e) >> 10 & 1) != 0)) {
    defaultValue = (char *)(local_28 + 0x10);
    if ((*(ushort *)(local_28 + 0x1e) >> 0xc & 1) == 0) {
      defaultValue = (char *)(*(ulong *)(local_28 + 0x18) & 0xffffffffffff);
    }
  }
  return defaultValue;
}

Assistant:

const char *xmrig::Json::getString(const rapidjson::Value &obj, const char *key, const char *defaultValue)
{
    assert(obj.IsObject());

    auto i = obj.FindMember(key);
    if (i != obj.MemberEnd() && i->value.IsString()) {
        return i->value.GetString();
    }

    return defaultValue;
}